

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Document::parseTAGDirective(Document *this)

{
  size_type sVar1;
  mapped_type *pmVar2;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Chars_01;
  StringRef SVar3;
  StringRef TagHandle;
  StringRef local_88;
  StringRef local_70;
  Token Tag;
  
  getNext(&Tag,this);
  local_88.Data = Tag.Range.Data;
  local_88.Length = Tag.Range.Length;
  SVar3.Length = 2;
  SVar3.Data = " \t";
  sVar1 = StringRef::find_first_of(&local_88,SVar3,0);
  if (local_88.Length < sVar1) {
    sVar1 = local_88.Length;
  }
  TagHandle.Length = local_88.Length - sVar1;
  TagHandle.Data = local_88.Data + sVar1;
  Chars.Length = 2;
  Chars.Data = " \t";
  local_88 = StringRef::ltrim(&TagHandle,Chars);
  Chars_00.Length = 2;
  Chars_00.Data = " \t";
  TagHandle.Length = StringRef::find_first_of(&local_88,Chars_00,0);
  if (local_88.Length < TagHandle.Length) {
    TagHandle.Length = local_88.Length;
  }
  TagHandle.Data = local_88.Data;
  local_70.Data = local_88.Data + TagHandle.Length;
  local_70.Length = local_88.Length - TagHandle.Length;
  Chars_01.Length = 2;
  Chars_01.Data = " \t";
  SVar3 = StringRef::ltrim(&local_70,Chars_01);
  pmVar2 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,&TagHandle);
  pmVar2->Data = SVar3.Data;
  pmVar2->Length = SVar3.Length;
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Document::parseTAGDirective() {
  Token Tag = getNext(); // %TAG <handle> <prefix>
  StringRef T = Tag.Range;
  // Strip %TAG
  T = T.substr(T.find_first_of(" \t")).ltrim(" \t");
  std::size_t HandleEnd = T.find_first_of(" \t");
  StringRef TagHandle = T.substr(0, HandleEnd);
  StringRef TagPrefix = T.substr(HandleEnd).ltrim(" \t");
  TagMap[TagHandle] = TagPrefix;
}